

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O0

void ares_llist_node_mvparent_last(ares_llist_node_t *node,ares_llist_t *new_parent)

{
  ares_llist_t *new_parent_local;
  ares_llist_node_t *node_local;
  
  if ((node != (ares_llist_node_t *)0x0) && (new_parent != (ares_llist_t *)0x0)) {
    ares_llist_node_detach(node);
    ares_llist_attach_at(new_parent,ARES__LLIST_INSERT_TAIL,(ares_llist_node_t *)0x0,node);
  }
  return;
}

Assistant:

void ares_llist_node_mvparent_last(ares_llist_node_t *node,
                                   ares_llist_t      *new_parent)
{
  if (node == NULL || new_parent == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_llist_node_detach(node);
  ares_llist_attach_at(new_parent, ARES__LLIST_INSERT_TAIL, NULL, node);
}